

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.cpp
# Opt level: O0

void __thiscall
xmrig::Pool::Pool(Pool *this,char *host,uint16_t port,char *user,char *password,int keepAlive,
                 bool tls)

{
  undefined8 in_RSI;
  char *in_RDI;
  String *this_00;
  String *this_01;
  undefined1 __val;
  undefined4 in_R9D;
  Url *unaff_retaddr;
  Url *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  String *in_stack_ffffffffffffffa0;
  char *host_00;
  
  *(undefined4 *)in_RDI = in_R9D;
  in_RDI[4] = '\0';
  in_RDI[5] = '\0';
  in_RDI[6] = '\0';
  in_RDI[7] = '\0';
  host_00 = in_RDI;
  std::bitset<2UL>::bitset
            ((bitset<2UL> *)in_stack_ffffffffffffffa0,(unsigned_long_long)in_stack_ffffffffffffff98)
  ;
  String::String((String *)(in_RDI + 0x10));
  String::String(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  this_00 = (String *)(in_RDI + 0x30);
  String::String(this_00);
  this_01 = (String *)(in_RDI + 0x40);
  String::String(this_01,(char *)this_00);
  in_RDI[0x50] = -0x18;
  in_RDI[0x51] = '\x03';
  in_RDI[0x52] = '\0';
  in_RDI[0x53] = '\0';
  in_RDI[0x54] = '\0';
  in_RDI[0x55] = '\0';
  in_RDI[0x56] = '\0';
  in_RDI[0x57] = '\0';
  Url::Url(in_stack_ffffffffffffff90);
  __val = (undefined1)((ulong)(in_RDI + 0x88) >> 0x38);
  Url::Url(unaff_retaddr,host_00,(uint16_t)((ulong)in_RSI >> 0x30),SUB81((ulong)in_RSI >> 0x28,0),
           (Scheme)in_RSI);
  std::bitset<2UL>::set((bitset<2UL> *)this_01,(size_t)this_00,(bool)__val);
  return;
}

Assistant:

xmrig::Pool::Pool(const char *host, uint16_t port, const char *user, const char *password, int keepAlive, bool tls) :
    m_keepAlive(keepAlive),
    m_flags(1 << FLAG_ENABLED),
    m_password(password),
    m_user(user),
    m_pollInterval(kDefaultPollInterval),
    m_url(host, port, tls)
{
    m_flags.set(FLAG_TLS,      tls);
}